

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_models_md3.cpp
# Opt level: O0

void __thiscall FMD3Model::LoadGeometry(FMD3Model *this)

{
  uint uVar1;
  uint uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  void *pvVar6;
  MD3Surface *pMVar7;
  ulong uVar8;
  MD3Triangle *pMVar9;
  long lVar10;
  MD3TexCoord *pMVar11;
  MD3Vertex *pMVar12;
  long lVar13;
  int local_84;
  int i_3;
  md3_vertex_t *vt;
  int i_2;
  md3_texcoord_t *tc;
  int j;
  int i_1;
  md3_triangle_t *tris;
  md3_surface_t *ss;
  MD3Surface *s;
  long lStack_40;
  int i;
  md3_surface_t *surf;
  md3_header_t *hdr;
  char *buffer;
  FMemLump lumpdata;
  FMD3Model *this_local;
  
  lumpdata.Block.Chars = (FString)(FString)this;
  FWadCollection::ReadLump((FWadCollection *)&buffer,0xdb0460);
  pvVar6 = FMemLump::GetMem((FMemLump *)&buffer);
  lStack_40 = (long)pvVar6 + (ulong)*(uint *)((long)pvVar6 + 100);
  for (s._4_4_ = 0; s._4_4_ < this->numSurfaces; s._4_4_ = s._4_4_ + 1) {
    pMVar7 = this->surfaces + s._4_4_;
    uVar1 = *(uint *)(lStack_40 + 0x68);
    uVar2 = *(uint *)(lStack_40 + 0x58);
    auVar3._8_8_ = 0;
    auVar3._0_8_ = (long)pMVar7->numTriangles;
    uVar8 = SUB168(auVar3 * ZEXT816(0xc),0);
    if (SUB168(auVar3 * ZEXT816(0xc),8) != 0) {
      uVar8 = 0xffffffffffffffff;
    }
    pMVar9 = (MD3Triangle *)operator_new__(uVar8);
    pMVar7->tris = pMVar9;
    for (tc._4_4_ = 0; tc._4_4_ < pMVar7->numTriangles; tc._4_4_ = tc._4_4_ + 1) {
      for (tc._0_4_ = 0; (int)tc < 3; tc._0_4_ = (int)tc + 1) {
        pMVar7->tris[tc._4_4_].VertIndex[(int)tc] =
             *(int *)(lStack_40 + (ulong)uVar2 + (long)tc._4_4_ * 0xc + (long)(int)tc * 4);
      }
    }
    lVar10 = lStack_40 + (ulong)*(uint *)(lStack_40 + 0x60);
    auVar4._8_8_ = 0;
    auVar4._0_8_ = (long)pMVar7->numVertices;
    uVar8 = SUB168(auVar4 * ZEXT816(8),0);
    if (SUB168(auVar4 * ZEXT816(8),8) != 0) {
      uVar8 = 0xffffffffffffffff;
    }
    pMVar11 = (MD3TexCoord *)operator_new__(uVar8);
    pMVar7->texcoords = pMVar11;
    for (vt._4_4_ = 0; vt._4_4_ < pMVar7->numVertices; vt._4_4_ = vt._4_4_ + 1) {
      pMVar7->texcoords[vt._4_4_].s = *(float *)(lVar10 + (long)vt._4_4_ * 8);
      pMVar7->texcoords[vt._4_4_].t = *(float *)(lVar10 + 4 + (long)vt._4_4_ * 8);
    }
    lVar10 = lStack_40 + (ulong)*(uint *)(lStack_40 + 100);
    auVar5._8_8_ = 0;
    auVar5._0_8_ = (long)(pMVar7->numVertices * this->numFrames);
    uVar8 = SUB168(auVar5 * ZEXT816(0x18),0);
    if (SUB168(auVar5 * ZEXT816(0x18),8) != 0) {
      uVar8 = 0xffffffffffffffff;
    }
    pMVar12 = (MD3Vertex *)operator_new__(uVar8);
    pMVar7->vertices = pMVar12;
    for (local_84 = 0; local_84 < pMVar7->numVertices * this->numFrames; local_84 = local_84 + 1) {
      pMVar7->vertices[local_84].x = (float)(int)*(short *)(lVar10 + (long)local_84 * 8) * 0.015625;
      pMVar7->vertices[local_84].y =
           (float)(int)*(short *)(lVar10 + 2 + (long)local_84 * 8) * 0.015625;
      pMVar7->vertices[local_84].z =
           (float)(int)*(short *)(lVar10 + 4 + (long)local_84 * 8) * 0.015625;
      lVar13 = (long)local_84;
      pMVar12 = pMVar7->vertices;
      UnpackVector(*(unsigned_short *)(lVar10 + 6 + lVar13 * 8),&pMVar12[lVar13].nx,
                   &pMVar12[lVar13].ny,&pMVar12[lVar13].nz);
    }
    lStack_40 = lStack_40 + (ulong)uVar1;
  }
  FMemLump::~FMemLump((FMemLump *)&buffer);
  return;
}

Assistant:

void FMD3Model::LoadGeometry()
{
	FMemLump lumpdata = Wads.ReadLump(mLumpNum);
	const char *buffer = (const char *)lumpdata.GetMem();
	md3_header_t * hdr = (md3_header_t *)buffer;
	md3_surface_t * surf = (md3_surface_t*)(buffer + LittleLong(hdr->Ofs_Surfaces));

	for(int i=0;i<numSurfaces;i++)
	{
		MD3Surface * s = &surfaces[i];
		md3_surface_t * ss = surf;

		surf = (md3_surface_t *)(((char*)surf) + LittleLong(surf->Ofs_End));

		// copy triangle indices
		md3_triangle_t * tris = (md3_triangle_t*)(((char*)ss)+LittleLong(ss->Ofs_Triangles));
		s->tris = new MD3Triangle[s->numTriangles];

		for(int i=0;i<s->numTriangles;i++) for (int j=0;j<3;j++)
		{
			s->tris[i].VertIndex[j]=LittleLong(tris[i].vt_index[j]);
		}

		// Load texture coordinates
		md3_texcoord_t * tc = (md3_texcoord_t*)(((char*)ss)+LittleLong(ss->Ofs_Texcoord));
		s->texcoords = new MD3TexCoord[s->numVertices];

		for(int i=0;i<s->numVertices;i++)
		{
			s->texcoords[i].s = tc[i].s;
			s->texcoords[i].t = tc[i].t;
		}

		// Load vertices and texture coordinates
		md3_vertex_t * vt = (md3_vertex_t*)(((char*)ss)+LittleLong(ss->Ofs_XYZNormal));
		s->vertices = new MD3Vertex[s->numVertices * numFrames];

		for(int i=0;i<s->numVertices * numFrames;i++)
		{
			s->vertices[i].x = LittleShort(vt[i].x)/64.f;
			s->vertices[i].y = LittleShort(vt[i].y)/64.f;
			s->vertices[i].z = LittleShort(vt[i].z)/64.f;
			UnpackVector( LittleShort(vt[i].n), s->vertices[i].nx, s->vertices[i].ny, s->vertices[i].nz);
		}
	}
}